

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::EntrySetPrototypeOf(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  CallInfo object_00;
  RecyclableObject *newPrototype_00;
  RecyclableObject *newPrototype;
  RecyclableObject *object;
  int32 errCode;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x32d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x32e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSVar4 = RecyclableObject::GetScriptContext(function);
  object._4_4_ = 0;
  if (1 < ((uint)scriptContext & 0xffffff)) {
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
    BVar3 = JavascriptConversion::CheckObjectCoercible(pvVar6,pSVar4);
    if (BVar3 != 0) {
      if (2 < ((uint)scriptContext & 0xffffff)) {
        pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,2);
        BVar3 = Js::JavascriptOperators::IsObjectOrNull(pvVar6);
        if (BVar3 != 0) goto LAB_012d3646;
      }
      object._4_4_ = -0x7ff5ec31;
      goto LAB_012d3646;
    }
  }
  object._4_4_ = -0x7ff5ec36;
LAB_012d3646:
  if (object._4_4_ == 0) {
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
    BVar3 = Js::JavascriptOperators::IsObject(pvVar6);
    if (BVar3 == 0) {
      callInfo_local = (CallInfo)Arguments::operator[]((Arguments *)&scriptContext,1);
    }
    else {
      pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
      JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pvVar6);
      pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
      object_00 = (CallInfo)VarTo<Js::RecyclableObject>(pvVar6);
      pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,2);
      newPrototype_00 = VarTo<Js::RecyclableObject>(pvVar6);
      ChangePrototype((RecyclableObject *)object_00,newPrototype_00,true,pSVar4);
      callInfo_local = object_00;
    }
    return (Var)callInfo_local;
  }
  JavascriptError::ThrowTypeError(pSVar4,object._4_4_,L"Object.setPrototypeOf");
}

Assistant:

Var JavascriptObject::EntrySetPrototypeOf(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    Assert(!(callInfo.Flags & CallFlags_New));
    ScriptContext* scriptContext = function->GetScriptContext();

    // 19.1.2.18
    // Object.setPrototypeOf ( O, proto )
    // When the setPrototypeOf function is called with arguments O and proto, the following steps are taken:
    // 1. Let O be RequireObjectCoercible(O).
    // 2. ReturnIfAbrupt(O).
    // 3. If Type(proto) is neither Object or Null, then throw a TypeError exception.
    int32 errCode = NOERROR;

    if (args.Info.Count < 2 || !JavascriptConversion::CheckObjectCoercible(args[1], scriptContext))
    {
        errCode = JSERR_FunctionArgument_NeedObject;
    }
    else if (args.Info.Count < 3 || !JavascriptOperators::IsObjectOrNull(args[2]))
    {
        errCode = JSERR_FunctionArgument_NotObjectOrNull;
    }

    if (errCode != NOERROR)
    {
        JavascriptError::ThrowTypeError(scriptContext, errCode, _u("Object.setPrototypeOf"));
    }

    // 4. If Type(O) is not Object, return O.
    if (!JavascriptOperators::IsObject(args[1]))
    {
        return args[1];
    }

#if ENABLE_COPYONACCESS_ARRAY
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(args[1]);
#endif
    RecyclableObject* object = VarTo<RecyclableObject>(args[1]);
    RecyclableObject* newPrototype = VarTo<RecyclableObject>(args[2]);

    // 5. Let status be O.[[SetPrototypeOf]](proto).
    // 6. ReturnIfAbrupt(status).
    // 7. If status is false, throw a TypeError exception.
    ChangePrototype(object, newPrototype, /*shouldThrow*/true, scriptContext);

    // 8. Return O.
    return object;
}